

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CheckerInstanceBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext_const&,unsigned_int&,bool&,slang::bitmask<slang::ast::InstanceFlags>&>
          (BumpAllocator *this,Compilation *args,CheckerSymbol *args_1,
          AssertionInstanceDetails *args_2,ASTContext *args_3,uint *args_4,bool *args_5,
          bitmask<slang::ast::InstanceFlags> *args_6)

{
  CheckerInstanceBodySymbol *this_00;
  
  this_00 = (CheckerInstanceBodySymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerInstanceBodySymbol *)this->endPtr < this_00 + 1) {
    this_00 = (CheckerInstanceBodySymbol *)allocateSlow(this,0xd0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::CheckerInstanceBodySymbol::CheckerInstanceBodySymbol
            (this_00,args,args_1,args_2,args_3,*args_4,*args_5,
             (bitmask<slang::ast::InstanceFlags>)args_6->m_bits);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }